

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

bool inipp::extract<char,short>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,short *dst)

{
  uint *puVar1;
  long *plVar2;
  istream *piVar3;
  bool bVar4;
  short result;
  char c;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> is;
  uint auStack_178 [90];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)value,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_is + -0x18));
  *puVar1 = *puVar1 | 1;
  plVar2 = (long *)std::istream::operator>>((istream *)&is,&result);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    piVar3 = std::operator>>((istream *)&is,&c);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      *dst = result;
      bVar4 = true;
      goto LAB_0010b035;
    }
  }
  bVar4 = false;
LAB_0010b035:
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return bVar4;
}

Assistant:

inline bool extract(const std::basic_string<CharT> & value, T & dst) {
	CharT c;
	std::basic_istringstream<CharT> is{ value };
	T result;
	if ((is >> std::boolalpha >> result) && !(is >> c)) {
		dst = result;
		return true;
	}
	else {
		return false;
	}
}